

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitDataSegment(PrintSExpression *this,DataSegment *curr)

{
  anon_unknown_217 *this_00;
  size_type sVar1;
  reference this_01;
  pointer other;
  ostream *poVar2;
  char *__str;
  ostream *poVar3;
  Name *this_02;
  bool bVar4;
  Name name;
  Name name_00;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  ostream *local_38;
  char *local_30;
  anon_unknown_217 *local_28;
  ostream *local_20;
  DataSegment *local_18;
  DataSegment *curr_local;
  PrintSExpression *this_local;
  
  local_18 = curr;
  curr_local = (DataSegment *)this;
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  printMajor(this->o,"data ");
  local_28 = (anon_unknown_217 *)(local_18->super_Named).name.super_IString.str._M_len;
  poVar3 = (ostream *)(local_18->super_Named).name.super_IString.str._M_str;
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)poVar3;
  local_20 = poVar3;
  anon_unknown_217::printName(local_28,name,poVar3);
  std::operator<<(this->o,' ');
  if ((local_18->isPassive & 1U) != 0) goto LAB_0197cda0;
  bVar4 = true;
  if (this->currModule != (Module *)0x0) {
    sVar1 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&this->currModule->memories);
    bVar4 = sVar1 != 0;
  }
  if (!bVar4) {
    __assert_fail("!currModule || currModule->memories.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                  ,0xd15,"void wasm::PrintSExpression::visitDataSegment(DataSegment *)");
  }
  if (this->currModule == (Module *)0x0) {
LAB_0197cd38:
    poVar2 = std::operator<<(this->o,"(memory $");
    poVar3 = (ostream *)(local_18->memory).super_IString.str._M_len;
    local_30 = (local_18->memory).super_IString.str._M_str;
    name_00.super_IString.str._M_str = (char *)poVar3;
    name_00.super_IString.str._M_len = (size_t)local_30;
    local_38 = poVar3;
    poVar2 = wasm::operator<<((wasm *)poVar2,poVar3,name_00);
    std::operator<<(poVar2,") ");
  }
  else {
    this_02 = &local_18->memory;
    poVar3 = (ostream *)this_02;
    this_01 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[](&this->currModule->memories,0);
    other = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_01);
    bVar4 = IString::operator!=(&this_02->super_IString,(IString *)other);
    if (bVar4) goto LAB_0197cd38;
  }
  visit(this,local_18->offset);
  std::operator<<(this->o,' ');
LAB_0197cda0:
  this_00 = (anon_unknown_217 *)this->o;
  __str = std::vector<char,_std::allocator<char>_>::data(&local_18->data);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&local_18->data);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,__str,sVar1);
  str._M_str = (char *)poVar3;
  str._M_len = (size_t)local_48._M_str;
  anon_unknown_217::printEscapedString(this_00,(ostream *)local_48._M_len,str);
  poVar3 = std::operator<<(this->o,')');
  std::operator<<(poVar3,this->maybeNewLine);
  return;
}

Assistant:

void visitDataSegment(DataSegment* curr) {
    doIndent(o, indent);
    o << '(';
    printMajor(o, "data ");
    printName(curr->name, o);
    o << ' ';
    if (!curr->isPassive) {
      assert(!currModule || currModule->memories.size() > 0);
      if (!currModule || curr->memory != currModule->memories[0]->name) {
        o << "(memory $" << curr->memory << ") ";
      }
      visit(curr->offset);
      o << ' ';
    }
    printEscapedString(o, {curr->data.data(), curr->data.size()});
    o << ')' << maybeNewLine;
  }